

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_long,fmt::FormatSpec>
          (BasicWriter<char> *this,unsigned_long value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  char code;
  undefined4 uVar1;
  uint uVar2;
  CharPtr pcVar3;
  ulong uVar4;
  byte *pbVar5;
  lconv *plVar6;
  unsigned_long uVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  StringRef SVar11;
  char prefix [4];
  uint uStack_34;
  
  uVar1 = spec._20_4_;
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  uVar8 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    prefix[0] = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      prefix[0] = 0x20;
    }
    prefix[1] = '\0';
    prefix[2] = '\0';
    prefix[3] = '\0';
    uVar8 = 1;
  }
  code = spec.type_;
  spec._20_4_ = uVar1;
  if (spec.type_ == '\0') {
LAB_00145181:
    uVar2 = internal::count_digits(value);
    pcVar3 = prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar8);
    internal::format_decimal<unsigned_long,char,fmt::internal::NoThousandsSep>(pcVar3 + 1,value,0);
    return;
  }
  if (spec.type_ == 'B') {
LAB_0014522d:
    uVar2 = uVar8;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar8] = '0';
      uVar2 = uVar8 | 2;
      prefix[(ulong)uVar8 + 1] = spec.type_;
    }
    uVar8 = 0;
    uVar7 = value;
    do {
      uVar8 = uVar8 + 1;
      bVar10 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar10);
    pbVar5 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar8,&spec,prefix,uVar2);
    do {
      *pbVar5 = (byte)value & 1 | 0x30;
      pbVar5 = pbVar5 + -1;
      bVar10 = 1 < value;
      value = value >> 1;
    } while (bVar10);
  }
  else {
    if (spec.type_ != 'X') {
      if (spec.type_ == 'b') goto LAB_0014522d;
      if (spec.type_ != 'x') {
        if (spec.type_ == 'n') {
          uVar2 = internal::count_digits(value);
          plVar6 = localeconv();
          SVar11 = internal::thousands_sep<lconv>(plVar6);
          pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                             (this,(int)SVar11.size_ * ((uVar2 - 1) / 3) + uVar2,&spec,prefix,uVar8)
          ;
          thousands_sep._16_8_ = (ulong)uStack_34 << 0x20;
          thousands_sep.sep_ = SVar11;
          internal::format_decimal<unsigned_long,char,fmt::internal::ThousandsSep>
                    (pcVar3 + 1,value,0,thousands_sep);
          return;
        }
        if (spec.type_ == 'o') {
          if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
            uVar4 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            prefix[uVar4] = '0';
          }
          uVar2 = 0;
          uVar7 = value;
          do {
            uVar2 = uVar2 + 1;
            bVar10 = 7 < uVar7;
            uVar7 = uVar7 >> 3;
          } while (bVar10);
          pbVar5 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar8);
          do {
            *pbVar5 = (byte)value & 7 | 0x30;
            pbVar5 = pbVar5 + -1;
            bVar10 = 7 < value;
            value = value >> 3;
          } while (bVar10);
          return;
        }
        if (spec.type_ != 'd') {
          pcVar9 = "char";
          if (((undefined1  [24])spec & (undefined1  [24])0x1000000000) == (undefined1  [24])0x0) {
            pcVar9 = "integer";
          }
          internal::report_unknown_type(code,pcVar9);
        }
        goto LAB_00145181;
      }
    }
    uVar2 = uVar8;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar8] = '0';
      uVar2 = uVar8 | 2;
      prefix[(ulong)uVar8 + 1] = spec.type_;
    }
    uVar8 = 0;
    uVar7 = value;
    do {
      uVar8 = uVar8 + 1;
      bVar10 = 0xf < uVar7;
      uVar7 = uVar7 >> 4;
    } while (bVar10);
    pcVar3 = prepare_int_buffer<fmt::FormatSpec>(this,uVar8,&spec,prefix,uVar2);
    pcVar9 = "0123456789ABCDEF";
    if (spec.type_ == 'x') {
      pcVar9 = "0123456789abcdef";
    }
    do {
      *pcVar3 = pcVar9[(uint)value & 0xf];
      pcVar3 = pcVar3 + -1;
      bVar10 = 0xf < value;
      value = value >> 4;
    } while (bVar10);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}